

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram.c
# Opt level: O0

Ngram Ngram_init_from_bin(char *mem)

{
  size_t sVar1;
  Ngram pNVar2;
  size_t *psVar3;
  HashVocab pHVar4;
  UniGram_T *pUVar5;
  LowGram_T **ppLVar6;
  uint local_24;
  uint32_t order;
  size_t vocab_mem_size;
  Ngram model;
  char *mem_local;
  
  pNVar2 = (Ngram)malloc(0x30);
  pNVar2->ngram_order = *(uint32_t *)mem;
  psVar3 = (size_t *)(mem + 4);
  pNVar2->ngram_counts = psVar3;
  psVar3 = psVar3 + pNVar2->ngram_order;
  sVar1 = *psVar3;
  pHVar4 = HashVocab_init_from_bin((char *)(psVar3 + 1));
  pNVar2->vocab = pHVar4;
  pUVar5 = (UniGram_T *)(sVar1 + (long)(psVar3 + 1));
  pNVar2->uni_gram = pUVar5;
  model = (Ngram)(pUVar5 + *pNVar2->ngram_counts + 1);
  if (pNVar2->ngram_order < 3) {
    pNVar2->low_grams = (LowGram_T **)0x0;
  }
  else {
    ppLVar6 = (LowGram_T **)malloc((ulong)(pNVar2->ngram_order - 2) << 3);
    pNVar2->low_grams = ppLVar6;
    for (local_24 = 2; local_24 < pNVar2->ngram_order; local_24 = local_24 + 1) {
      pNVar2->low_grams[local_24 - 2] = (LowGram_T *)model;
      model = (Ngram)(&model->vocab + pNVar2->ngram_counts[local_24 - 1] * 2);
    }
  }
  if (pNVar2->ngram_order < 2) {
    pNVar2->high_gram = (HighGram_T *)0x0;
  }
  else {
    pNVar2->high_gram = (HighGram_T *)model;
  }
  return pNVar2;
}

Assistant:

Ngram Ngram_init_from_bin(const char* mem){//assume ending is same
#define READ(ret, typ, ptr) ret =*(typ *)ptr;\
                            ptr+=sizeof(typ);
    Ngram model = malloc(sizeof(struct Ngram_T));
    READ(model->ngram_order, uint32_t, mem)

    model->ngram_counts = (size_t*)mem;
    mem += sizeof(size_t)*model->ngram_order;

    size_t vocab_mem_size;
    READ(vocab_mem_size, size_t, mem);
    //printf("vocab_mem_size:%zu\n", vocab_mem_size);
    model->vocab = HashVocab_init_from_bin(mem);
    mem += vocab_mem_size;

    model->uni_gram = (UniGram_T *)mem;
    mem += sizeof(UniGram_T) * (model->ngram_counts[0]+1);

    if (model->ngram_order > 2) {
        model->low_grams = malloc(sizeof(LowGram_T *)*(model->ngram_order-2));
        for (uint32_t order = 2; order < model->ngram_order; order++) {
            model->low_grams[order-2] = (LowGram_T*)mem;
            mem += sizeof(LowGram_T) * (model->ngram_counts[order-1]+1);
        }
    }else{
        model->low_grams = NULL;
    }
    if (model->ngram_order > 1) {
        model->high_gram = (HighGram_T *)mem; 
    }else{
        model->high_gram = NULL;
    }
    return model;
}